

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setDateTimeRange(QDateTimeEdit *this,QDateTime *min,QDateTime *max)

{
  bool bVar1;
  QDateTimeEditPrivate *pQVar2;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QDateTime maximum;
  QDateTime minimum;
  QDateTime *in_stack_ffffffffffffff58;
  QDateTime *in_stack_ffffffffffffff60;
  undefined1 *local_58;
  undefined1 *local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QDateTimeEdit *)0x559035);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime::toTimeZone((QTimeZone *)&local_50);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = operator>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    QDateTime::QDateTime((QDateTime *)&local_58,(QDateTime *)&local_50);
  }
  else {
    QDateTime::toTimeZone((QTimeZone *)&local_58);
  }
  ::QVariant::QVariant(&local_28,(QDateTime *)&local_50);
  ::QVariant::QVariant(&local_48,(QDateTime *)&local_58);
  (**(code **)(*(long *)&(pQVar2->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xb0))
            (pQVar2,&local_28,&local_48);
  ::QVariant::~QVariant(&local_48);
  ::QVariant::~QVariant(&local_28);
  QDateTime::~QDateTime((QDateTime *)&local_58);
  QDateTime::~QDateTime((QDateTime *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setDateTimeRange(const QDateTime &min, const QDateTime &max)
{
    Q_D(QDateTimeEdit);
    // FIXME: does none of the range checks applied to setMin/setMax methods !
    const QDateTime minimum = min.toTimeZone(d->timeZone);
    const QDateTime maximum = (min > max ? minimum : max.toTimeZone(d->timeZone));
    d->setRange(minimum, maximum);
}